

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O0

void __thiscall wasm::HeapType::HeapType(HeapType *this,Continuation continuation)

{
  HeapType HVar1;
  unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
  local_20;
  HeapType *local_18;
  HeapType *this_local;
  Continuation continuation_local;
  
  local_18 = this;
  this_local = (HeapType *)continuation.type.id;
  std::make_unique<wasm::(anonymous_namespace)::HeapTypeInfo,wasm::Continuation&>
            ((Continuation *)&local_20);
  HVar1 = anon_unknown_0::RecGroupStore::insert
                    ((RecGroupStore *)wasm::(anonymous_namespace)::globalRecGroupStore,&local_20);
  this->id = (uintptr_t)HVar1;
  std::
  unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
  ::~unique_ptr(&local_20);
  return;
}

Assistant:

HeapType::HeapType(Continuation continuation) {
  new (this) HeapType(
    globalRecGroupStore.insert(std::make_unique<HeapTypeInfo>(continuation)));
}